

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_verify_allocator_stuff(void)

{
  char *unaff_retaddr;
  char *in_stack_00000008;
  ErrorType in_stack_00000010;
  ErrorLevel in_stack_00000014;
  
  ma_stats.calls[0x20] = ma_stats.calls[0x20] + 1;
  sprintf(ma_ebuf,"unavailable; recompile MA with -DVERIFY");
  ma_error(in_stack_00000014,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return 0;
}

Assistant:

public Boolean MA_verify_allocator_stuff()
{
#ifdef VERIFY

    char    *preamble;    /* printed before block error messages */

    int        heap_blocks;
    int        bad_heap_blocks;
    int        bad_heap_checksums;
    int        bad_heap_lguards;
    int        bad_heap_rguards;
    int        stack_blocks;
    int        bad_stack_blocks;
    int        bad_stack_checksums;
    int        bad_stack_lguards;
    int        bad_stack_rguards;

#ifdef STATS
    ma_stats.calls[(int)FID_MA_verify_allocator_stuff]++;
#endif /* STATS */

    preamble = "MA_verify_allocator_stuff: starting scan ...\n";

    /* check each block on the heap used list */
    list_verify(ma_hused,
        "heap",
        preamble,
        &heap_blocks,
        &bad_heap_blocks,
        &bad_heap_checksums,
        &bad_heap_lguards,
        &bad_heap_rguards);

    if (bad_heap_blocks > 0)
        /* only print preamble once */
        preamble = (char *)NULL;

    /* check each block on the stack used list */
    list_verify(ma_sused,
        "stack",
        preamble,
        &stack_blocks,
        &bad_stack_blocks,
        &bad_stack_checksums,
        &bad_stack_lguards,
        &bad_stack_rguards);

    if ((bad_heap_blocks > 0) || (bad_stack_blocks > 0))
    {
        Boolean    old_ma_error_print;

        /* print postamble */
        (void)printf("MA_verify_allocator_stuff: scan completed\n");

        /* construct a summary of the results */
        (void)sprintf(ma_ebuf, "\n\t\t\t\theap\tstack\n\t\t\t\t----\t-----\n\tchecksum errors\t\t%4d\t%5d\n\tleft signature errors\t%4d\t%5d\n\tright signature errors\t%4d\t%5d\n\ttotal bad blocks\t%4d\t%5d\n\ttotal blocks\t\t%4d\t%5d",
            bad_heap_checksums,
            bad_stack_checksums,
            bad_heap_lguards,
            bad_stack_lguards,
            bad_heap_rguards,
            bad_stack_rguards,
            bad_heap_blocks,
            bad_stack_blocks,
            heap_blocks,
            stack_blocks);

        /* print the summary on stderr */
        old_ma_error_print = ma_error_print;
        ma_error_print = MA_TRUE;
        ma_error(EL_Nonfatal, ET_External, "MA_verify_allocator_stuff", ma_ebuf);
        ma_error_print = old_ma_error_print;

        /* problems were found */
        return MA_FALSE;
    }
    else
        /* no problems found */
        return MA_TRUE;

#else

#ifdef STATS
    ma_stats.calls[(int)FID_MA_verify_allocator_stuff]++;
#endif /* STATS */

    (void)sprintf(ma_ebuf,
        "unavailable; recompile MA with -DVERIFY");
    ma_error(EL_Nonfatal, ET_External, "MA_verify_allocator_stuff", ma_ebuf);
    return MA_FALSE;

#endif /* VERIFY */
}